

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_GetSetPosition_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_GetSetPosition_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  bool bVar1;
  AssertHelper *this_00;
  double *in_RDI;
  AssertionResult gtest_ar;
  int d;
  PositionType newPosition;
  ParticleType particle;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint uVar2;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  Type in_stack_ffffffffffffff5c;
  AssertHelper *in_stack_ffffffffffffff60;
  Real in_stack_ffffffffffffff68;
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *in_stack_ffffffffffffff70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int idx;
  PositionType local_68;
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *in_stack_ffffffffffffffb0;
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
            (in_stack_ffffffffffffffb0);
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::getPosition
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(Real)in_stack_ffffffffffffff60,
             (Real)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  pica::Particle<(pica::Dimension)3>::setPosition
            ((Particle<(pica::Dimension)3> *)&stack0xffffffffffffffb0,&local_68);
  idx = 0;
  while( true ) {
    if (2 < idx) {
      return;
    }
    this_00 = (AssertHelper *)pica::Vector3<double>::operator[](&local_68,idx);
    pica::Particle<(pica::Dimension)3>::getPosition
              ((PositionType *)&stack0xffffffffffffff68,
               (Particle<(pica::Dimension)3> *)&stack0xffffffffffffffb0);
    pica::Vector3<double>::operator[]((Vector3<double> *)&stack0xffffffffffffff68,idx);
    testing::internal::EqHelper<false>::Compare<double,double>
              ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_RDI,
               (double *)this_00);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff80);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff60);
      testing::AssertionResult::failure_message((AssertionResult *)0x1ff2d3);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff4c,
                 (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(idx,in_stack_ffffffffffffff90),
                 (Message *)in_stack_ffffffffffffff88.ptr_);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x1ff31f);
    }
    uVar2 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ff37f);
    if (uVar2 != 0) break;
    idx = idx + 1;
    in_stack_ffffffffffffff44 = 0;
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetPosition)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;

    ParticleType particle = this->randomParticle();
    PositionType newPosition = this->getPosition(54.126, -431.35, 35.65);
    particle.setPosition(newPosition);
    ASSERT_EQ_VECTOR(newPosition, particle.getPosition(), this->dimension);
}